

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

ON_3dmView * __thiscall ON_ClassArray<ON_3dmView>::AppendNew(ON_ClassArray<ON_3dmView> *this)

{
  int iVar1;
  
  if (this->m_count == this->m_capacity) {
    iVar1 = NewCapacity(this);
    Reserve(this,(long)iVar1);
  }
  else {
    ON_3dmView::~ON_3dmView(this->m_a + this->m_count);
    ON_3dmView::ON_3dmView(this->m_a + this->m_count);
  }
  iVar1 = this->m_count;
  this->m_count = iVar1 + 1;
  return this->m_a + iVar1;
}

Assistant:

T& ON_ClassArray<T>::AppendNew()
{
  if ( m_count == m_capacity ) 
  {
    int newcapacity = NewCapacity();
    Reserve( newcapacity );
  }
  else
  {
    // First destroy what's there ..
    DestroyElement(m_a[m_count]);
    // and then get a properly initialized element
    ConstructDefaultElement(&m_a[m_count]);
  }
  return m_a[m_count++];
}